

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  uint uVar7;
  uint uVar8;
  UBool *pUVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  char cVar13;
  uint8_t *puVar14;
  uint8_t *s_00;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  int local_b8;
  uint local_b4;
  OffsetList local_70;
  UnicodeSet *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar6 = spanNotUTF8(this,s,length);
    return iVar6;
  }
  local_48 = &this->spanSet;
  uVar5 = UnicodeSet::spanUTF8(local_48,(char *)s,length,USET_SPAN_CONTAINED);
  local_b8 = length - uVar5;
  if (local_b8 != 0) {
    local_70.list = local_70.staticList;
    local_70.capacity = 0;
    local_70.length = 0;
    local_70.start = 0;
    if (spanCondition == USET_SPAN_CONTAINED) {
      iVar21 = this->maxLength8;
      iVar20 = 0x10;
      pUVar9 = local_70.list;
      if (((long)iVar21 < 0x11) ||
         (pUVar9 = (UBool *)uprv_malloc_63((long)iVar21), iVar20 = iVar21, pUVar9 != (UBool *)0x0))
      {
        local_70.list = pUVar9;
        local_70.capacity = iVar20;
      }
      memset(local_70.list,0,(long)local_70.capacity);
    }
    uVar4 = this->strings->count;
    lVar23 = 0;
    if (this->all != '\0') {
      lVar23 = (long)(int)uVar4 * 2;
    }
    local_40 = this->spanLengths + lVar23;
    uVar8 = uVar5;
    do {
      s_00 = this->utf8;
      if (spanCondition == USET_SPAN_CONTAINED) {
        if (0 < (int)uVar4) {
          uVar15 = 0;
          do {
            iVar21 = this->utf8Lengths[uVar15];
            lVar23 = (long)iVar21;
            if (lVar23 != 0) {
              bVar3 = local_40[uVar15];
              uVar7 = (uint)bVar3;
              if (bVar3 == 0xff) {
                s_00 = s_00 + lVar23;
                cVar13 = '\x06';
              }
              else {
                if ((bVar3 == 0xfe) && (uVar7 = iVar21 - 1, (char)s_00[lVar23 + -1] < -0x40)) {
                  uVar7 = utf8_back1SafeBody_63(s_00,0,uVar7);
                }
                uVar12 = uVar8;
                if ((int)uVar7 < (int)uVar8) {
                  uVar12 = uVar7;
                }
                if ((int)(iVar21 - uVar12) <= local_b8) {
                  if ((int)uVar8 <= (int)uVar7) {
                    uVar7 = uVar8;
                  }
                  lVar10 = (long)(int)uVar7;
                  puVar14 = s + ((int)uVar5 - lVar10);
                  iVar20 = iVar21 - uVar12;
                  do {
                    if (-0x41 < (char)s[(int)uVar5 - lVar10]) {
                      iVar6 = local_70.capacity;
                      if (local_70.start + iVar20 < local_70.capacity) {
                        iVar6 = 0;
                      }
                      iVar16 = (local_70.start + iVar20) - iVar6;
                      if (local_70.list[iVar16] == '\0') {
                        lVar18 = 0;
                        iVar19 = iVar21;
                        do {
                          puVar1 = puVar14 + lVar18;
                          puVar2 = s_00 + lVar18;
                          if (*puVar1 != *puVar2) break;
                          lVar18 = lVar18 + 1;
                          bVar24 = 1 < iVar19;
                          iVar19 = iVar19 + -1;
                        } while (bVar24);
                        if (*puVar1 == *puVar2) {
                          if (iVar20 == local_b8) {
                            cVar13 = '\x01';
                            local_b4 = length;
                            goto LAB_001a7cd0;
                          }
                          local_70.list[iVar16] = '\x01';
                          local_70.length = local_70.length + 1;
                        }
                      }
                    }
                    bVar24 = lVar10 == 0;
                    lVar10 = lVar10 + -1;
                    if (bVar24) break;
                    puVar14 = puVar14 + 1;
                    bVar24 = iVar20 != local_b8;
                    iVar20 = iVar20 + 1;
                  } while (bVar24);
                }
                s_00 = s_00 + lVar23;
                cVar13 = '\0';
              }
LAB_001a7cd0:
              if ((cVar13 != '\x06') && (uVar7 = local_b4, cVar13 != '\0')) goto LAB_001a7fbf;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar4);
        }
LAB_001a7ea0:
        if ((uVar8 == 0) && (uVar5 != 0)) {
          if (local_70.length == 0) {
            uVar8 = UnicodeSet::spanUTF8
                              (local_48,(char *)(s + (int)uVar5),local_b8,USET_SPAN_CONTAINED);
            uVar12 = uVar8 + uVar5;
            cVar13 = '\x01';
            uVar7 = uVar12;
            if ((local_b8 - uVar8 != 0) && (uVar8 != 0)) {
              cVar13 = '\x03';
              local_b8 = local_b8 - uVar8;
              uVar7 = local_b4;
              uVar5 = uVar12;
            }
          }
          else {
            uVar8 = spanOneUTF8(local_48,s + (int)uVar5,local_b8);
            if ((int)uVar8 < 1) goto LAB_001a7eef;
            uVar7 = length;
            if (local_b8 - uVar8 == 0) goto LAB_001a7f21;
            iVar6 = local_70.capacity;
            if ((int)(local_70.start + uVar8) < local_70.capacity) {
              iVar6 = 0;
            }
            local_70.start = (local_70.start + uVar8) - iVar6;
            if (local_70.list[local_70.start] != '\0') {
              local_70.list[local_70.start] = '\0';
              local_70.length = local_70.length + -1;
            }
            cVar13 = '\x03';
            local_b8 = local_b8 - uVar8;
LAB_001a7f0c:
            uVar5 = uVar8 + uVar5;
            uVar8 = 0;
            uVar7 = local_b4;
          }
        }
        else {
          uVar7 = uVar5;
          if (local_70.length != 0) {
LAB_001a7eef:
            uVar8 = OffsetList::popMinimum(&local_70);
            local_b8 = local_b8 - uVar8;
            cVar13 = '\0';
            goto LAB_001a7f0c;
          }
LAB_001a7f21:
          cVar13 = '\x01';
        }
      }
      else {
        if ((int)uVar4 < 1) {
          bVar24 = true;
          iVar21 = 0;
        }
        else {
          local_38 = s + (int)uVar5;
          uVar17 = 0;
          uVar15 = 0;
          iVar21 = 0;
          do {
            uVar7 = this->utf8Lengths[uVar17];
            if ((long)(int)uVar7 != 0) {
              uVar12 = (uint)local_40[uVar17];
              if (0xfd < local_40[uVar17]) {
                uVar12 = uVar7;
              }
              uVar11 = uVar8;
              if ((int)uVar12 < (int)uVar8) {
                uVar11 = uVar12;
              }
              iVar20 = uVar7 - uVar11;
              if ((iVar20 <= local_b8) && (iVar16 = (int)uVar15, iVar16 <= (int)uVar11)) {
                if ((int)uVar8 <= (int)uVar12) {
                  uVar12 = uVar8;
                }
                lVar23 = (long)local_38 - (long)(int)uVar12;
                uVar22 = (long)(int)uVar12;
                do {
                  if ((-0x41 < (char)s[(long)(int)uVar5 - uVar22]) &&
                     (((long)iVar16 < (long)uVar22 || (iVar21 < iVar20)))) {
                    lVar10 = 0;
                    uVar12 = uVar7;
                    do {
                      puVar1 = (uint8_t *)(lVar23 + lVar10);
                      puVar14 = s_00 + lVar10;
                      if (*puVar1 != *puVar14) break;
                      lVar10 = lVar10 + 1;
                      bVar24 = 1 < (int)uVar12;
                      uVar12 = uVar12 - 1;
                    } while (bVar24);
                    if (*puVar1 == *puVar14) {
                      uVar15 = uVar22 & 0xffffffff;
                      iVar21 = iVar20;
                      break;
                    }
                  }
                  if (local_b8 <= iVar20) break;
                  iVar20 = iVar20 + 1;
                  lVar23 = lVar23 + 1;
                  bVar24 = (long)iVar16 < (long)uVar22;
                  uVar22 = uVar22 - 1;
                } while (bVar24);
              }
              s_00 = s_00 + (int)uVar7;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar4);
          bVar24 = (int)uVar15 == 0;
        }
        cVar13 = '\0';
        bVar24 = (bool)(iVar21 == 0 & bVar24);
        uVar7 = local_b4;
        if (!bVar24) {
          uVar5 = uVar5 + iVar21;
          local_b8 = local_b8 - iVar21;
          cVar13 = (local_b8 != 0) * '\x02' + '\x01';
          uVar7 = length;
          if (local_b8 != 0) {
            uVar8 = 0;
            uVar7 = local_b4;
          }
        }
        local_b4 = uVar7;
        uVar7 = local_b4;
        if (bVar24) goto LAB_001a7ea0;
      }
LAB_001a7fbf:
      local_b4 = uVar7;
    } while ((cVar13 == '\0') || (cVar13 == '\x03'));
    OffsetList::~OffsetList(&local_70);
    length = local_b4;
  }
  return length;
}

Assistant:

int32_t UnicodeSetStringSpan::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotUTF8(s, length);
    }
    int32_t spanLength=spanSet.spanUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    U8_BACK_1(s8, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            !offsets.containsOffset(inc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            (overlap>maxOverlap ||
                                /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.spanUTF8((const char *)s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneUTF8(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}